

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

void print_node3(Abc_Obj_t *pObj)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  char m [6];
  
  m[0] = '\0';
  uVar1 = *(uint *)&pObj->field_0x14;
  if ((uVar1 & 0x10) != 0) {
    sVar2 = strlen(m);
    (m + sVar2)[0] = 'A';
    (m + sVar2)[1] = '\0';
  }
  if ((uVar1 & 0x20) != 0) {
    sVar2 = strlen(m);
    (m + sVar2)[0] = 'B';
    (m + sVar2)[1] = '\0';
  }
  if ((uVar1 & 0x40) != 0) {
    sVar2 = strlen(m);
    (m + sVar2)[0] = 'C';
    (m + sVar2)[1] = '\0';
  }
  printf("\nnode %d type=%d mark=%d %s\n",(ulong)(uint)pObj->Id,(ulong)(uVar1 & 0xf),
         (ulong)*(ushort *)(pManMR->pDataArray + (uint)pObj->Id),m);
  puts("fanouts");
  for (lVar3 = 0; lVar3 < (pObj->vFanouts).nSize; lVar3 = lVar3 + 1) {
    print_node((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]]);
    putchar(10);
  }
  puts("fanins");
  for (lVar3 = 0; lVar3 < (pObj->vFanins).nSize; lVar3 = lVar3 + 1) {
    print_node((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]]);
    putchar(10);
  }
  return;
}

Assistant:

void
print_node3(Abc_Obj_t *pObj) {
  int i;
  Abc_Obj_t * pNext;
  char m[6];

  m[0] = 0;
  if (pObj->fMarkA)
    strcat(m, "A");
  if (pObj->fMarkB)
    strcat(m, "B");
  if (pObj->fMarkC)
    strcat(m, "C");

  printf("\nnode %d type=%d mark=%d %s\n", Abc_ObjId(pObj), Abc_ObjType(pObj), FDATA(pObj)->mark, m);
  printf("fanouts\n");
  Abc_ObjForEachFanout( pObj, pNext, i ) {
    print_node(pNext);
    printf("\n");
  }
  printf("fanins\n");
  Abc_ObjForEachFanin( pObj, pNext, i ) {
    print_node(pNext);
    printf("\n");
  }
}